

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Performance::LoopCase::~LoopCase(LoopCase *this)

{
  ~LoopCase(this);
  operator_delete(this,0x1f0);
  return;
}

Assistant:

LoopCase::~LoopCase (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_arrayBuffer)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}
}